

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptString.cpp
# Opt level: O0

Var Js::JavascriptString::EntryNormalize(RecyclableObject *function,CallInfo callInfo,...)

{
  code *pcVar1;
  NormalizationForm normalizationForm;
  JavascriptString *scriptContext_00;
  bool bVar2;
  int iVar3;
  CallFlags e;
  BOOL BVar4;
  charcount_t testStringLength;
  ScriptContext *pSVar5;
  ThreadContext *this;
  Var *values;
  undefined4 *puVar6;
  Var pvVar7;
  char16 *pcVar8;
  JavascriptLibrary *this_00;
  TempArenaAllocatorObject *local_b0;
  CallInfo local_98;
  JavascriptString *retVal;
  char16 *buffer;
  ArenaAllocator *pAStack_80;
  charcount_t sizeEstimate;
  ArenaAllocator *tempAllocator;
  TempArenaAllocatorObject *temptempAllocator;
  JavascriptString *formStr;
  CallInfo CStack_60;
  NormalizationForm form;
  JavascriptString *pThis;
  ScriptContext *scriptContext;
  ArgumentReader args;
  Var *_argsVarArray;
  RecyclableObject *function_local;
  CallInfo callInfo_local;
  
  function_local = (RecyclableObject *)callInfo;
  pSVar5 = RecyclableObject::GetScriptContext(function);
  this = ScriptContext::GetThreadContext(pSVar5);
  pSVar5 = RecyclableObject::GetScriptContext(function);
  ThreadContext::ProbeStack(this,0xc00,pSVar5,(PVOID)0x0);
  iVar3 = _count_args((CallInfo)function_local);
  values = _get_va(&stack0x00000000,iVar3);
  args.super_Arguments.Values = (Type)function_local;
  bVar2 = CallInfo::operator==((CallInfo *)(values + -1),(CallInfo)function_local);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptString.cpp"
                                ,0x5d3,
                                "(*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo)",
                                "*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 0;
  }
  ArgumentReader::ArgumentReader
            ((ArgumentReader *)&scriptContext,(CallInfo *)&function_local,values);
  pThis = (JavascriptString *)RecyclableObject::GetScriptContext(function);
  e = Js::operator&((CallFlags)((ulong)function_local >> 0x18) &
                    (CallFlags_InternalFrame|CallFlags_NewTarget|CallFlags_Wrapped|CallFlags_NotUsed
                     |CallFlags_ExtraArg|CallFlags_Eval|CallFlags_Value|CallFlags_New),CallFlags_New
                   );
  bVar2 = operator!(e);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptString.cpp"
                                ,0x5d6,"(!(callInfo.Flags & CallFlags_New))",
                                "!(callInfo.Flags & CallFlags_New)");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 0;
  }
  CStack_60 = (CallInfo)0x0;
  GetThisStringArgument
            ((ArgumentReader *)&scriptContext,(ScriptContext *)pThis,L"String.prototype.normalize",
             (JavascriptString **)&stack0xffffffffffffffa0);
  formStr._4_4_ = C;
  if ((1 < ((uint)scriptContext & 0xffffff)) &&
     (BVar4 = Js::JavascriptOperators::IsUndefinedObject
                        (*(Var *)((long)args.super_Arguments.Info + 8)), BVar4 == 0)) {
    pvVar7 = Arguments::operator[]((Arguments *)&scriptContext,1);
    bVar2 = VarIs<Js::JavascriptString>(pvVar7);
    if (bVar2) {
      local_b0 = (TempArenaAllocatorObject *)UnsafeVarTo<Js::JavascriptString>(pvVar7);
    }
    else {
      local_b0 = (TempArenaAllocatorObject *)0x0;
    }
    temptempAllocator = local_b0;
    if (local_b0 == (TempArenaAllocatorObject *)0x0) {
      pvVar7 = Arguments::operator[]((Arguments *)&scriptContext,1);
      temptempAllocator =
           (TempArenaAllocatorObject *)JavascriptConversion::ToString(pvVar7,(ScriptContext *)pThis)
      ;
    }
    iVar3 = (*(temptempAllocator->super_FinalizableObject).super_IRecyclerVisitedObject.
              _vptr_IRecyclerVisitedObject[0x6b])(temptempAllocator,L"NFD",3);
    if (iVar3 == 0) {
      iVar3 = (*(temptempAllocator->super_FinalizableObject).super_IRecyclerVisitedObject.
                _vptr_IRecyclerVisitedObject[0x6b])(temptempAllocator,L"NFKC",4);
      if (iVar3 == 0) {
        iVar3 = (*(temptempAllocator->super_FinalizableObject).super_IRecyclerVisitedObject.
                  _vptr_IRecyclerVisitedObject[0x6b])(temptempAllocator,L"NFKD",4);
        if (iVar3 == 0) {
          iVar3 = (*(temptempAllocator->super_FinalizableObject).super_IRecyclerVisitedObject.
                    _vptr_IRecyclerVisitedObject[0x6b])(temptempAllocator,L"NFC",3);
          scriptContext_00 = pThis;
          if (iVar3 == 0) {
            pcVar8 = GetString((JavascriptString *)temptempAllocator);
            JavascriptError::ThrowRangeErrorVar
                      ((ScriptContext *)scriptContext_00,-0x7ff5ea1f,pcVar8);
          }
        }
        else {
          formStr._4_4_ = KD;
        }
      }
      else {
        formStr._4_4_ = KC;
      }
    }
    else {
      formStr._4_4_ = D;
    }
  }
  normalizationForm = formStr._4_4_;
  pcVar8 = (char16 *)(**(code **)(*(long *)CStack_60 + 0x328))();
  testStringLength = GetLength((JavascriptString *)CStack_60);
  bVar2 = PlatformAgnostic::UnicodeText::IsNormalizedString
                    (normalizationForm,pcVar8,testStringLength);
  if (bVar2) {
    callInfo_local = CStack_60;
  }
  else {
    tempAllocator =
         (ArenaAllocator *)ScriptContext::GetTemporaryAllocator((ScriptContext *)pThis,L"normalize")
    ;
    pAStack_80 = TempArenaAllocatorWrapper<false>::GetAllocator
                           ((TempArenaAllocatorWrapper<false> *)tempAllocator);
    buffer._4_4_ = 0;
    pcVar8 = GetNormalizedString((JavascriptString *)CStack_60,formStr._4_4_,pAStack_80,
                                 (charcount_t *)((long)&buffer + 4));
    if (pcVar8 == (char16 *)0x0) {
      if (buffer._4_4_ != 0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar6 = 1;
        bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptString.cpp"
                                    ,0x603,"(sizeEstimate == 0)","sizeEstimate == 0");
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar6 = 0;
      }
      this_00 = ScriptContext::GetLibrary((ScriptContext *)pThis);
      local_98 = (CallInfo)JavascriptLibrary::GetEmptyString(this_00);
    }
    else {
      local_98 = (CallInfo)NewCopyBuffer(pcVar8,buffer._4_4_,(ScriptContext *)pThis);
    }
    ScriptContext::ReleaseTemporaryAllocator
              ((ScriptContext *)pThis,(TempArenaAllocatorObject *)tempAllocator);
    callInfo_local = local_98;
  }
  return (Var)callInfo_local;
}

Assistant:

Var JavascriptString::EntryNormalize(RecyclableObject* function, CallInfo callInfo, ...)
    {
        using namespace PlatformAgnostic;

        PROBE_STACK(function->GetScriptContext(), Js::Constants::MinStackDefault);

        ARGUMENTS(args, callInfo);
        ScriptContext* scriptContext = function->GetScriptContext();

        Assert(!(callInfo.Flags & CallFlags_New));

        JavascriptString *pThis = nullptr;
        GetThisStringArgument(args, scriptContext, _u("String.prototype.normalize"), &pThis);

        UnicodeText::NormalizationForm form = UnicodeText::NormalizationForm::C;

        if (args.Info.Count >= 2 && !(JavascriptOperators::IsUndefinedObject(args.Values[1])))
        {
            JavascriptString *formStr = JavascriptOperators::TryFromVar<JavascriptString>(args[1]);
            if (!formStr)
            {
                formStr = JavascriptConversion::ToString(args[1], scriptContext);
            }

            if (formStr->BufferEquals(_u("NFD"), 3))
            {
                form = UnicodeText::NormalizationForm::D;
            }
            else if (formStr->BufferEquals(_u("NFKC"), 4))
            {
                form = UnicodeText::NormalizationForm::KC;
            }
            else if (formStr->BufferEquals(_u("NFKD"), 4))
            {
                form = UnicodeText::NormalizationForm::KD;
            }
            else if (!formStr->BufferEquals(_u("NFC"), 3))
            {
                JavascriptError::ThrowRangeErrorVar(scriptContext, JSERR_InvalidNormalizationForm, formStr->GetString());
            }
        }

        if (UnicodeText::IsNormalizedString(form, pThis->GetSz(), pThis->GetLength()))
        {
            return pThis;
        }

        BEGIN_TEMP_ALLOCATOR(tempAllocator, scriptContext, _u("normalize"));

        charcount_t sizeEstimate = 0;
        char16* buffer = pThis->GetNormalizedString(form, tempAllocator, sizeEstimate);
        JavascriptString * retVal;
        if (buffer == nullptr)
        {
            Assert(sizeEstimate == 0);
            retVal = scriptContext->GetLibrary()->GetEmptyString();
        }
        else
        {
            retVal = JavascriptString::NewCopyBuffer(buffer, sizeEstimate, scriptContext);
        }

        END_TEMP_ALLOCATOR(tempAllocator, scriptContext);
        return retVal;
    }